

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void highbd_write_buffer_8xn_sse4_1
               (__m128i *in,uint16_t *output,int stride,int flipud,int height,int bd)

{
  int iVar1;
  undefined8 *puVar2;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long lVar4;
  int iVar5;
  longlong in_R8;
  ulong in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i res1;
  __m128i pred;
  __m128i alVar7;
  __m128i u;
  __m128i v;
  int i;
  int step;
  int j;
  int in_stack_ffffffffffffff78;
  int local_7c;
  int local_4c;
  int local_44;
  ulong uVar3;
  ulong uVar6;
  
  iVar5 = (int)in_R8;
  if (in_ECX == 0) {
    local_7c = 0;
  }
  else {
    local_7c = iVar5 + -1;
  }
  local_44 = local_7c;
  uVar3 = (ulong)in_ECX;
  iVar1 = 1;
  if (in_ECX != 0) {
    iVar1 = -1;
  }
  lVar4 = in_RSI;
  uVar6 = in_R9;
  for (local_4c = 0; local_4c < iVar5; local_4c = local_4c + 1) {
    alVar7[1] = (long)(local_44 + iVar5) << 4;
    pred[0] = in_R9 & 0xffffffff;
    alVar7[0] = uVar3;
    res1[1] = uVar6;
    res1[0] = in_R8;
    pred[1] = lVar4;
    alVar7 = highbd_get_recon_8x8_sse4_1(pred,alVar7,res1,in_stack_ffffffffffffff78);
    uVar3 = alVar7[1];
    puVar2 = (undefined8 *)(in_RSI + (long)(local_4c * in_EDX) * 2);
    *puVar2 = extraout_XMM0_Qa;
    puVar2[1] = extraout_XMM0_Qb;
    local_44 = iVar1 + local_44;
  }
  return;
}

Assistant:

static inline void highbd_write_buffer_8xn_sse4_1(__m128i *in, uint16_t *output,
                                                  int stride, int flipud,
                                                  int height, const int bd) {
  int j = flipud ? (height - 1) : 0;
  const int step = flipud ? -1 : 1;
  for (int i = 0; i < height; ++i, j += step) {
    __m128i v = _mm_loadu_si128((__m128i const *)(output + i * stride));
    __m128i u = highbd_get_recon_8x8_sse4_1(v, in[j], in[j + height], bd);

    _mm_storeu_si128((__m128i *)(output + i * stride), u);
  }
}